

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

void dictionary_unset(dictionary *d,char *key)

{
  uint uVar1;
  int iVar2;
  long local_28;
  ssize_t i;
  uint hash;
  char *key_local;
  dictionary *d_local;
  
  if ((key != (char *)0x0) && (d != (dictionary *)0x0)) {
    uVar1 = dictionary_hash(key);
    local_28 = 0;
    while ((local_28 < d->size &&
           (((d->key[local_28] == (char *)0x0 || (uVar1 != d->hash[local_28])) ||
            (iVar2 = strcmp(key,d->key[local_28]), iVar2 != 0))))) {
      local_28 = local_28 + 1;
    }
    if (local_28 < d->size) {
      free(d->key[local_28]);
      d->key[local_28] = (char *)0x0;
      if (d->val[local_28] != (char *)0x0) {
        free(d->val[local_28]);
        d->val[local_28] = (char *)0x0;
      }
      d->hash[local_28] = 0;
      d->n = d->n + -1;
    }
  }
  return;
}

Assistant:

void dictionary_unset(dictionary * d, const char * key)
{
    unsigned    hash ;
    ssize_t      i ;

    if (key == NULL || d == NULL) {
        return;
    }

    hash = dictionary_hash(key);
    for (i = 0 ; i < d->size ; i++) {
        if (d->key[i] == NULL)
            continue ;
        /* Compare hash */
        if (hash == d->hash[i]) {
            /* Compare string, to avoid hash collisions */
            if (!strcmp(key, d->key[i])) {
                /* Found key */
                break ;
            }
        }
    }
    if (i >= d->size)
        /* Key not found */
        return ;

    free(d->key[i]);
    d->key[i] = NULL ;
    if (d->val[i] != NULL) {
        free(d->val[i]);
        d->val[i] = NULL ;
    }
    d->hash[i] = 0 ;
    d->n -- ;
    return ;
}